

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

void __thiscall FParser::ErrorMessage(FParser *this,FString *msg)

{
  DFsScript *pDVar1;
  char *value;
  int stop;
  int iVar2;
  FString *this_00;
  undefined8 extraout_RAX;
  char *temp;
  char *pcVar3;
  int extraout_EDX;
  ulong uVar4;
  long lVar5;
  svalue_t *returnvar;
  code *UNRECOVERED_JUMPTABLE;
  long lVar6;
  long *plVar7;
  int iStack_50;
  int iStack_4c;
  svalue_t *psStack_48;
  FString FStack_40;
  
  pDVar1 = this->Script;
  pcVar3 = pDVar1->data;
  uVar4 = 0;
  if (((pcVar3 <= this->Rover) && (this->Rover <= pcVar3 + pDVar1->len)) &&
     (pcVar3 < this->LineStart)) {
    uVar4 = 0;
    do {
      uVar4 = (ulong)((int)uVar4 + (uint)(*pcVar3 == '\n'));
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != this->LineStart);
  }
  iStack_50 = (int)msg->Chars;
  pcVar3 = "Script %d, line %d: %s";
  returnvar = (svalue_t *)(ulong)(uint)pDVar1->scriptnum;
  FS_Error("Script %d, line %d: %s",returnvar,uVar4);
  iStack_4c = extraout_EDX;
  if ((((FParser *)pcVar3)->TokenType[extraout_EDX] == operator_) &&
     (((FParser *)pcVar3)->TokenType[iStack_50] == operator_)) {
    PointlessBrackets((FParser *)pcVar3,&iStack_4c,&iStack_50);
  }
  stop = iStack_50;
  if (iStack_4c == iStack_50) {
    SimpleEvaluate((FParser *)pcVar3,returnvar,iStack_4c);
    return;
  }
  lVar6 = (long)num_operators;
  psStack_48 = returnvar;
  if (0 < lVar6) {
    lVar5 = 0;
    do {
      value = *(char **)((long)&operators[0].string + lVar5);
      if (*(int *)((long)&operators[0].direction + lVar5) == 0) {
        iVar2 = FindOperatorBackwards((FParser *)pcVar3,iStack_4c,stop,value);
      }
      else {
        iVar2 = FindOperator((FParser *)pcVar3,iStack_4c,stop,value);
      }
      if (iVar2 != -1) {
        UNRECOVERED_JUMPTABLE = *(code **)((long)&operators[0].handler + lVar5);
        plVar7 = (long *)((long)((FParser *)pcVar3)->Tokens +
                         *(long *)(&operators[0].field_0x10 + lVar5) + -0x10);
        if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar7 + -1);
        }
        (*UNRECOVERED_JUMPTABLE)(plVar7,psStack_48,iStack_4c,iVar2,stop,UNRECOVERED_JUMPTABLE);
        return;
      }
      lVar5 = lVar5 + 0x20;
    } while (lVar6 * 0x20 != lVar5);
  }
  if (((FParser *)pcVar3)->TokenType[iStack_4c] == function) {
    EvaluateFunction((FParser *)pcVar3,psStack_48,iStack_4c,stop);
    return;
  }
  FStack_40.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if (iStack_4c <= stop) {
    lVar6 = 0;
    do {
      this_00 = FString::operator+=(&FStack_40,((FParser *)pcVar3)->Tokens[iStack_4c + lVar6]);
      FString::operator+=(this_00,' ');
      lVar6 = lVar6 + 1;
    } while ((stop - iStack_4c) + 1 != (int)lVar6);
  }
  script_error("couldnt evaluate expression: %s\n",FStack_40.Chars);
  FString::~FString(&FStack_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void FParser::ErrorMessage(FString msg)
{
	int linenum = 0;

	// find the line number
	if(Rover >= Script->data && Rover <= Script->data+Script->len)
    {
		char *temp;
		for(temp = Script->data; temp<LineStart; temp++)
			if(*temp == '\n') linenum++;    // count EOLs
    }

	//lineinfo.Format("Script %d, line %d: ", Script->scriptnum, linenum);
	FS_Error("Script %d, line %d: %s", Script->scriptnum, linenum, msg.GetChars());
}